

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

void __thiscall Fl_Slider::draw_bg(Fl_Slider *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  int iVar2;
  Fl_Color c;
  Fl_Color black;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Slider *this_local;
  
  fl_push_clip(X,Y,W,H);
  Fl_Widget::draw_box((Fl_Widget *)this);
  fl_pop_clip();
  iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
  c = 8;
  if (iVar2 != 0) {
    c = 0;
  }
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 == '\x04') {
    Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,X + W / 2 + -2,Y,4,H,c);
  }
  else {
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 == '\x05') {
      Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,X,Y + H / 2 + -2,W,4,c);
    }
  }
  return;
}

Assistant:

void Fl_Slider::draw_bg(int X, int Y, int W, int H) {
  fl_push_clip(X, Y, W, H);
  draw_box();
  fl_pop_clip();

  Fl_Color black = active_r() ? FL_FOREGROUND_COLOR : FL_INACTIVE_COLOR;
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(FL_THIN_DOWN_BOX, X+W/2-2, Y, 4, H, black);
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(FL_THIN_DOWN_BOX, X, Y+H/2-2, W, 4, black);
  }
}